

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

Result emulator_write_state_to_file(Emulator *e,char *filename)

{
  Result RVar1;
  undefined1 local_30 [8];
  FileData file_data;
  Result result;
  char *filename_local;
  Emulator *e_local;
  
  file_data.size._4_4_ = ERROR;
  emulator_init_state_file_data((FileData *)local_30);
  RVar1 = emulator_write_state(e,(FileData *)local_30);
  if ((RVar1 == OK) && (RVar1 = file_write(filename,(FileData *)local_30), RVar1 == OK)) {
    file_data.size._4_4_ = OK;
  }
  file_data_delete((FileData *)local_30);
  return file_data.size._4_4_;
}

Assistant:

Result emulator_write_state_to_file(Emulator* e, const char* filename) {
  Result result = ERROR;
  FileData file_data;
  emulator_init_state_file_data(&file_data);
  CHECK(SUCCESS(emulator_write_state(e, &file_data)));
  CHECK(SUCCESS(file_write(filename, &file_data)));
  result = OK;
error:
  file_data_delete(&file_data);
  return result;
}